

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kosaraju_scc.cpp
# Opt level: O1

void __thiscall KosarajuSCC::_set_levels(KosarajuSCC *this,int start,int sink)

{
  vector<int,std::allocator<int>> *this_00;
  iterator *piVar1;
  _Bit_type *p_Var2;
  pointer pvVar3;
  iterator iVar4;
  bool bVar5;
  _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_01;
  int iVar6;
  int iVar7;
  mapped_type *pmVar8;
  pointer piVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  _Elt_pointer piVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  size_type __n;
  int edges;
  vector<bool,_std::allocator<bool>_> seen;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  scc_graph_ends;
  queue<int,_std::deque<int,_std::allocator<int>_>_> topo;
  stack<int,_std::deque<int,_std::allocator<int>_>_> s;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  scc_graph_out;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  matrix;
  allocator_type local_1ad;
  int local_1ac;
  uint local_1a8;
  int local_1a4;
  ulong local_1a0;
  undefined1 local_198 [16];
  _Bit_type *local_188;
  ulong uStack_180;
  _Bit_pointer local_178;
  undefined1 local_168 [8];
  pointer piStack_160;
  _Bit_type *local_158;
  uint uStack_150;
  undefined4 uStack_14c;
  _Bit_pointer local_148;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_138;
  int local_120;
  int local_11c;
  _Deque_base<int,_std::allocator<int>_> local_118;
  _Deque_base<int,_std::allocator<int>_> local_c8;
  _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_70;
  _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_68;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_60;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_48;
  
  iVar7 = (this->scc).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[start];
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_last = (int *)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur = (int *)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_first = (int *)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_cur = (int *)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_1a4 = start;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map(&local_c8,0);
  if (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_c8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
              ((deque<int,std::allocator<int>> *)&local_c8,&local_1a4);
  }
  else {
    *local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_1a4;
    local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  local_118._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_118._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_60,
           (long)((int)((ulong)((long)(this->sccs).
                                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->sccs).
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555)
           ,(value_type *)&local_118,(allocator_type *)local_198);
  if ((__buckets_ptr)local_118._M_impl.super__Deque_impl_data._M_map != (__buckets_ptr)0x0) {
    operator_delete(local_118._M_impl.super__Deque_impl_data._M_map);
  }
  local_138.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (vector<int,_std::allocator<int>_> *)0x0;
  local_138.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (vector<int,_std::allocator<int>_> *)0x0;
  local_198._0_8_ = local_198._0_8_ & 0xffffffffffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_118,
             (long)((int)((ulong)((long)(this->sccs).
                                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->sccs).
                                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                   -0x55555555),(bool *)local_198,(allocator_type *)local_168);
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            (&(this->is_mand).super__Bvector_base<std::allocator<bool>_>);
  (this->is_mand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)local_118._M_impl.super__Deque_impl_data._M_start._M_last;
  (this->is_mand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p =
       (_Bit_type *)local_118._M_impl.super__Deque_impl_data._M_start._M_cur;
  *(_Elt_pointer *)
   &(this->is_mand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_offset =
       local_118._M_impl.super__Deque_impl_data._M_start._M_first;
  (this->is_mand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p =
       (_Bit_type *)local_118._M_impl.super__Deque_impl_data._M_map;
  *(size_t *)
   &(this->is_mand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_offset =
       local_118._M_impl.super__Deque_impl_data._M_map_size;
  local_118._M_impl.super__Deque_impl_data._M_map_size =
       local_118._M_impl.super__Deque_impl_data._M_map_size & 0xffffffff00000000;
  local_118._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_start._M_first =
       (_Elt_pointer)
       ((ulong)local_118._M_impl.super__Deque_impl_data._M_start._M_first & 0xffffffff00000000);
  local_118._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)((ulong)local_118._M_impl.super__Deque_impl_data._M_map & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_198,(long)this->nb_nodes,
             (bool *)&local_118,(allocator_type *)local_168);
  __n = (size_type)
        ((int)((ulong)((long)(this->sccs).
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->sccs).
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555);
  local_168 = (undefined1  [8])((ulong)(uint)local_168._4_4_ << 0x20);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_118,__n,(value_type_conflict1 *)local_168,
             (allocator_type *)&local_1ac);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_48,__n,(value_type *)&local_118,(allocator_type *)&local_1a8);
  if ((__buckets_ptr)local_118._M_impl.super__Deque_impl_data._M_map != (__buckets_ptr)0x0) {
    operator_delete(local_118._M_impl.super__Deque_impl_data._M_map);
  }
  piVar1 = &local_118._M_impl.super__Deque_impl_data._M_finish;
  local_118._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_map_size = 1;
  local_118._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x3f800000;
  local_118._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_120 = sink;
  local_11c = iVar7;
  local_118._M_impl.super__Deque_impl_data._M_map = &piVar1->_M_cur;
  std::
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_move_assign(&(this->level2mandscc)._M_h,&local_118);
  std::
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&local_118);
  local_118._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_map_size = 1;
  local_118._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x3f800000;
  local_118._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_68 = (_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)&this->mandscc2somenode;
  local_118._M_impl.super__Deque_impl_data._M_map = &piVar1->_M_cur;
  std::
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_move_assign();
  local_70 = (_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)&this->level2mandscc;
  std::
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&local_118);
  local_1ac = 0;
  if (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_c8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    local_1a0 = 0;
  }
  else {
    local_1a0 = 0;
    do {
      piVar13 = local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
        piVar13 = local_c8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
      }
      iVar7 = piVar13[-1];
      uVar17 = (ulong)iVar7;
      uVar11 = uVar17 + 0x3f;
      if (-1 < (long)uVar17) {
        uVar11 = uVar17;
      }
      *(ulong *)(local_198._0_8_ +
                (((long)uVar11 >> 6) +
                ((ulong)((uVar17 & 0x800000000000003f) < 0x8000000000000001) - 1)) * 8) =
           *(ulong *)(local_198._0_8_ +
                     (((long)uVar11 >> 6) +
                     ((ulong)((uVar17 & 0x800000000000003f) < 0x8000000000000001) - 1)) * 8) |
           1L << ((byte)iVar7 & 0x3f);
      if (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
        operator_delete(local_c8._M_impl.super__Deque_impl_data._M_finish._M_first);
        local_c8._M_impl.super__Deque_impl_data._M_finish._M_first =
             local_c8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_c8._M_impl.super__Deque_impl_data._M_finish._M_last =
             local_c8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x80;
        local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_c8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x7f;
        local_c8._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_c8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
      }
      else {
        local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
      }
      iVar6 = (*this->_vptr_KosarajuSCC[4])(this);
      if ((char)iVar6 != '\0') {
        piVar9 = (this->scc).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar6 = piVar9[uVar17];
        uVar14 = (ulong)iVar6;
        uVar11 = uVar14 + 0x3f;
        if (-1 < (long)uVar14) {
          uVar11 = uVar14;
        }
        p_Var2 = (this->is_mand).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
        uVar16 = (ulong)((uVar14 & 0x800000000000003f) < 0x8000000000000001);
        uVar10 = p_Var2[((long)uVar11 >> 6) + uVar16 + 0xffffffffffffffff];
        if ((uVar10 >> (uVar14 & 0x3f) & 1) == 0) {
          p_Var2[((long)uVar11 >> 6) + uVar16 + 0xffffffffffffffff] =
               1L << ((byte)iVar6 & 0x3f) | uVar10;
          local_118._M_impl.super__Deque_impl_data._M_map =
               (_Map_pointer)
               CONCAT44(local_118._M_impl.super__Deque_impl_data._M_map._4_4_,piVar9[uVar17]);
          pmVar8 = std::__detail::
                   _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[](local_68,(key_type *)&local_118);
          *pmVar8 = iVar7;
          local_1a0 = (ulong)((int)local_1a0 + 1);
        }
      }
      pvVar3 = (this->outgoing).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar9 = pvVar3[uVar17].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pvVar3[uVar17].super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish != piVar9) {
        uVar11 = 0;
        uVar14 = 1;
        do {
          local_118._M_impl.super__Deque_impl_data._M_map =
               (_Map_pointer)
               CONCAT44(local_118._M_impl.super__Deque_impl_data._M_map._4_4_,
                        *(undefined4 *)
                         (*(long *)&(this->ends).
                                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[piVar9[uVar11]].
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data + 4));
          iVar7 = (*this->_vptr_KosarajuSCC[2])(this);
          if (((char)iVar7 == '\0') &&
             (iVar7 = (*this->_vptr_KosarajuSCC[3])(this), (char)iVar7 == '\0')) {
            piVar9 = (this->scc).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            iVar7 = piVar9[uVar17];
            iVar6 = piVar9[(int)local_118._M_impl.super__Deque_impl_data._M_map];
            if ((iVar7 != iVar6) &&
               (local_48.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar7].
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[iVar6] == 0)) {
              this_00 = (vector<int,std::allocator<int>> *)
                        (local_60.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + iVar7);
              iVar4._M_current = *(int **)(this_00 + 8);
              if (iVar4._M_current == *(int **)(this_00 + 0x10)) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          (this_00,iVar4,&local_1ac);
              }
              else {
                *iVar4._M_current = local_1ac;
                *(int **)(this_00 + 8) = iVar4._M_current + 1;
              }
              if (local_138.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  local_138.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::_M_realloc_insert<>
                          (&local_138,
                           (iterator)
                           local_138.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
              }
              else {
                ((local_138.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->
                super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_start = (pointer)0x0;
                ((local_138.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->
                super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_finish = (pointer)0x0;
                ((local_138.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->
                super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_end_of_storage = (pointer)0x0;
                local_138.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     local_138.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 1;
              }
              iVar7 = (this->scc).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar17];
              iVar4._M_current =
                   local_138.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_finish;
              if (iVar4._M_current ==
                  local_138.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage) {
                local_168._0_4_ = iVar7;
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (local_138.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish + -1,iVar4,(int *)local_168);
              }
              else {
                *iVar4._M_current = iVar7;
                local_138.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish = iVar4._M_current + 1;
              }
              local_168._0_4_ =
                   (this->scc).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start
                   [(int)local_118._M_impl.super__Deque_impl_data._M_map];
              iVar4._M_current =
                   local_138.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_finish;
              if (iVar4._M_current ==
                  local_138.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (local_138.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish + -1,iVar4,(int *)local_168);
              }
              else {
                *iVar4._M_current = local_168._0_4_;
                local_138.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish = iVar4._M_current + 1;
              }
              local_1ac = local_1ac + 1;
              piVar9 = (this->scc).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              local_48.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[piVar9[uVar17]].
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [piVar9[(int)local_118._M_impl.super__Deque_impl_data._M_map]] = 1;
            }
            uVar10 = (ulong)(int)local_118._M_impl.super__Deque_impl_data._M_map;
            uVar11 = uVar10 + 0x3f;
            if (-1 < (long)uVar10) {
              uVar11 = uVar10;
            }
            if ((*(ulong *)(local_198._0_8_ +
                           (((long)uVar11 >> 6) +
                           ((ulong)((uVar10 & 0x800000000000003f) < 0x8000000000000001) - 1)) * 8)
                 >> (uVar10 & 0x3f) & 1) == 0) {
              if (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_c8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                          ((deque<int,std::allocator<int>> *)&local_c8,(int *)&local_118);
              }
              else {
                *local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     (int)local_118._M_impl.super__Deque_impl_data._M_map;
                local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
              }
            }
          }
          pvVar3 = (this->outgoing).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          piVar9 = pvVar3[uVar17].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          bVar5 = uVar14 < (ulong)((long)pvVar3[uVar17].
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_finish - (long)piVar9 >> 2);
          uVar11 = uVar14;
          uVar14 = (ulong)((int)uVar14 + 1);
        } while (bVar5);
      }
    } while (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_c8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  local_118._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map(&local_118,0);
  local_1a8 = local_1a8 & 0xffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_168,
             (long)((int)((ulong)((long)(this->sccs).
                                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->sccs).
                                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                   -0x55555555),(bool *)&local_1a8,&local_1ad);
  this_01 = local_70;
  if ((_Bit_type *)local_198._0_8_ != (_Bit_type *)0x0) {
    operator_delete((void *)local_198._0_8_);
  }
  local_178 = local_148;
  uStack_180 = CONCAT44(uStack_14c,uStack_150);
  local_188 = local_158;
  local_198._0_8_ = local_168;
  local_198._8_8_ = piStack_160;
  piStack_160 = (pointer)((ulong)piStack_160 & 0xffffffff00000000);
  local_158 = (_Bit_type *)0x0;
  uStack_150 = 0;
  topological_sort(this,local_11c,&local_60,&local_138,
                   (queue<int,_std::deque<int,_std::allocator<int>_>_> *)&local_118,
                   (vector<bool,_std::allocator<bool>_> *)local_198);
  iVar7 = (int)((long)(this->sccs).
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->sccs).
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x55555555;
  local_1a8 = iVar7 + 10;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_168,(long)iVar7,
             (value_type_conflict1 *)&local_1a8,(allocator_type *)&local_1ad);
  piVar9 = (this->levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_168;
  (this->levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = piStack_160;
  (this->levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_158;
  local_168 = (undefined1  [8])0x0;
  piStack_160 = (pointer)0x0;
  local_158 = (_Bit_type *)0x0;
  if (piVar9 != (pointer)0x0) {
    operator_delete(piVar9);
  }
  if (local_168 != (undefined1  [8])0x0) {
    operator_delete((void *)local_168);
  }
  (this->levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[(this->scc).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_start[local_120]] = (int)local_1a0;
  if (local_118._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_118._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      iVar7 = *(int *)(_Hash_node_base **)local_118._M_impl.super__Deque_impl_data._M_start._M_cur;
      if ((_Hash_node_base *)local_118._M_impl.super__Deque_impl_data._M_start._M_cur ==
          (_Hash_node_base *)
          ((long)&((_Hash_node_base *)
                  ((long)local_118._M_impl.super__Deque_impl_data._M_start._M_last + -8))->_M_nxt +
          4)) {
        operator_delete(local_118._M_impl.super__Deque_impl_data._M_start._M_first);
        local_118._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_118._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_118._M_impl.super__Deque_impl_data._M_start._M_last =
             (_Elt_pointer)((long)local_118._M_impl.super__Deque_impl_data._M_start._M_cur + 0x200);
        local_118._M_impl.super__Deque_impl_data._M_start._M_first =
             local_118._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_118._M_impl.super__Deque_impl_data._M_start._M_node =
             local_118._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_118._M_impl.super__Deque_impl_data._M_start._M_cur =
             (_Elt_pointer)
             ((long)(_Hash_node_base **)local_118._M_impl.super__Deque_impl_data._M_start._M_cur + 4
             );
      }
      uVar11 = (ulong)iVar7;
      iVar6 = (int)((ulong)((long)(this->sccs).
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->sccs).
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555 + 10
      ;
      piVar9 = local_60.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar11].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      lVar15 = (long)local_60.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar11].
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_finish - (long)piVar9;
      if (lVar15 != 0) {
        uVar17 = 0;
        do {
          iVar12 = (this->levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start
                   [local_138.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[piVar9[uVar17]].
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start[1]];
          if (iVar6 < iVar12) {
            iVar12 = iVar6;
          }
          iVar6 = iVar12;
          uVar17 = uVar17 + 1;
        } while ((uVar17 & 0xffffffff) < (ulong)(lVar15 >> 2));
      }
      piVar9 = (this->levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar12 = piVar9[uVar11];
      if (iVar6 < piVar9[uVar11]) {
        iVar12 = iVar6;
      }
      piVar9[uVar11] = iVar12;
      uVar17 = uVar11 + 0x3f;
      if (-1 < (long)uVar11) {
        uVar17 = uVar11;
      }
      if (((this->is_mand).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
           [((long)uVar17 >> 6) +
            (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
           (uVar11 & 0x3f) & 1) != 0) {
        piVar9[uVar11] = iVar12 + -1;
        pmVar8 = std::__detail::
                 _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[](this_01,piVar9 + uVar11);
        *pmVar8 = iVar7;
      }
    } while (local_118._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_118._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_118);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_48);
  if ((_Bit_type *)local_198._0_8_ != (_Bit_type *)0x0) {
    operator_delete((void *)local_198._0_8_);
    local_198._0_8_ = (_Bit_type *)0x0;
    local_198._8_8_ = local_198._8_8_ & 0xffffffff00000000;
    local_188 = (_Bit_type *)0x0;
    uStack_180 = uStack_180 & 0xffffffff00000000;
    local_178 = (_Bit_pointer)0x0;
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_138);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_60);
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_c8);
  return;
}

Assistant:

void KosarajuSCC::_set_levels(int start, int sink) {
	const int start_scc = scc_of(start);
	std::stack<int> s;
	s.push(start);

	std::vector<std::vector<int> > scc_graph_out =
			std::vector<std::vector<int> >(nb_sccs(), std::vector<int>());
	std::vector<std::vector<int> > scc_graph_ends;
	is_mand = std::vector<bool>(nb_sccs(), false);
	std::vector<bool> seen = std::vector<bool>(nb_nodes, false);
	std::vector<std::vector<int> > matrix =
			std::vector<std::vector<int> >(nb_sccs(), std::vector<int>(nb_sccs(), 0));

	level2mandscc = std::unordered_map<int, int>();
	mandscc2somenode = std::unordered_map<int, int>();
	int edges = 0;
	int mand_sccs = 0;
	while (!s.empty()) {
		const int u = s.top();
		seen[u] = true;
		s.pop();
		if (mandatory_node(u) && !is_mand[scc_of(u)]) {
			is_mand[scc_of(u)] = true;
			mandscc2somenode[scc_of(u)] = u;
			mand_sccs++;
		}
		for (unsigned int i = 0; i < outgoing[u].size(); ++i) {
			const int e = outgoing[u][i];
			const int v = ends[e][1];
			if (ignore_edge(e) || ignore_node(v)) {
				continue;
			}
			if (scc_of(u) != scc_of(v) && matrix[scc_of(u)][scc_of(v)] == 0) {
				scc_graph_out[scc_of(u)].push_back(edges);
				scc_graph_ends.emplace_back();
				scc_graph_ends.back().push_back(scc_of(u));
				scc_graph_ends.back().push_back(scc_of(v));
				edges++;
				matrix[scc_of(u)][scc_of(v)] = 1;
			}
			if (!seen[v]) {
				s.push(v);
			}
		}
	}
	/*std::cout<<"\n";
		std::cout<<"SCC GRAPH"<<std::endl;
		for (int i = 0; i < scc_graph_out.size(); i++) {
		for (int j = 0; j < scc_graph_out[i].size(); j++) {
		std::cout<<scc_graph_out[i][j]<<"(to "
		<<scc_graph_ends[scc_graph_out[i][j]][1]<<") ";
		}
		std::cout<<std::endl;
		}
		std::cout<<std::endl;
		std::cout<<"MANDS ";
		for (int i = 0; i < nb_sccs(); i++) {
		std::cout<<is_mand[i]<<" ";
		}
		std::cout<<std::endl;
		//*/
	std::queue<int> topo;
	seen = std::vector<bool>(nb_sccs(), false);
	topological_sort(start_scc, scc_graph_out, scc_graph_ends, topo, seen);

	levels = std::vector<int>(nb_sccs(), nb_sccs() + 10);
	levels[scc_of(sink)] = mand_sccs;

	while (!topo.empty()) {
		const int u = topo.front();
		topo.pop();
		int min = nb_sccs() + 10;
		// std::cout<<"Looking at "<<u<<std::endl;
		for (unsigned int i = 0; i < scc_graph_out[u].size(); ++i) {
			const int e = scc_graph_out[u][i];
			const int v = scc_graph_ends[e][1];
			min = (min < levels[v]) ? min : levels[v];
		}
		levels[u] = (min < levels[u]) ? min : levels[u];
		if (is_mand[u]) {
			levels[u] -= 1;
			level2mandscc[levels[u]] = u;
		}
	}
	/*std::cout<<"LEVELS: "<<mand_sccs<<"     ";
		for (int i = 0; i < nb_sccs(); i++)
		std::cout<<levels[i]<<" ";
		std::cout<<std::endl;
	*/
}